

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O1

void __thiscall
Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker
          (NonRecursiveReductionRunner *this,CSTMarker *marker,
          vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
          vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
          *tags)

{
  pointer *ppCVar1;
  StackEntryTag SVar2;
  pointer pCVar3;
  pointer pSVar4;
  pointer puVar5;
  atomic<int> *paVar6;
  semantic_value_type val;
  ulong uVar7;
  SymbolEntry sym;
  SymbolEntry local_48;
  
  uVar7 = marker->m_value;
  pCVar3 = (starts->super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pCVar3[-1].m_value ^ uVar7) & 0x7fff000000000000) != 0) {
    __assert_fail("marker.get_machine_id() == starts.back().get_machine_id()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                  ,0x47,
                  "void Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker(const CSTMarker &, std::vector<CSTMarker> &, std::vector<semantic_value_type> &, std::vector<detail::StackEntryTag> &)"
                 );
  }
  local_48.start = pCVar3[-1].m_value & 0xffffffffffff;
  local_48.end = uVar7 & 0xffffffffffff;
  local_48.id = uVar7 >> 0x30 & 0x7fff;
  pSVar4 = (tags->
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  SVar2 = pSVar4[-1];
  uVar7 = (ulong)(uint)SVar2;
  if (SVar2 < VALUE) {
    uVar7 = 0;
  }
  else {
    (tags->
    super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    )._M_impl.super__Vector_impl_data._M_finish = pSVar4 + -1;
  }
  pSVar4 = (tags->
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((tags->
       super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
       )._M_impl.super__Vector_impl_data._M_start != pSVar4) && (END_MARKER < pSVar4[-1])) {
    __assert_fail("tags.empty() || !detail::isValueTag(tags.back())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                  ,0x4f,
                  "void Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker(const CSTMarker &, std::vector<CSTMarker> &, std::vector<semantic_value_type> &, std::vector<detail::StackEntryTag> &)"
                 );
  }
  puVar5 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  val = (*this->m_listener)(&local_48,
                            puVar5 + (((ulong)((long)(values->
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)puVar5) >> 3) - uVar7),(int)uVar7,
                            this->m_listener_context);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (values,((long)(values->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(values->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3) - uVar7);
  paVar6 = this->reduction_counter;
  if (paVar6 != (atomic<int> *)0x0) {
    LOCK();
    (paVar6->super___atomic_base<int>)._M_i = (paVar6->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  pSVar4 = (tags->
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4[-1] == START_MARKER) {
    (tags->
    super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    )._M_impl.super__Vector_impl_data._M_finish = pSVar4 + -1;
    ppCVar1 = &(starts->
               super__Vector_base<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + -1;
    push_value(val,values,tags);
    return;
  }
  __assert_fail("tags.back() == detail::StackEntryTag::START_MARKER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                ,0x5a,
                "void Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker(const CSTMarker &, std::vector<CSTMarker> &, std::vector<semantic_value_type> &, std::vector<detail::StackEntryTag> &)"
               );
}

Assistant:

void reduce_by_end_marker(const CSTMarker& marker, std::vector<CSTMarker>& starts, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    assert(marker.get_machine_id() == starts.back().get_machine_id());
    SymbolEntry sym(marker.get_machine_id(), starts.back().get_offset(), marker.get_offset());
    int value_count = static_cast<int>(tags.back());
    if (value_count < 1) {
      value_count = 0;
    } else {
      tags.pop_back();
    }
    assert(tags.empty() || !detail::isValueTag(tags.back()));
#if PYCENTAURUS
    auto new_val = m_listener(&sym, values.data(), value_count, m_listener_context);
#else
    auto new_val = m_listener(&sym, &values[values.size() - value_count], value_count, m_listener_context);
    values.resize(values.size() - value_count);
#endif
    if (reduction_counter != nullptr) {
      (*reduction_counter)++;
    }

    assert(tags.back() == detail::StackEntryTag::START_MARKER);
    tags.pop_back();
    starts.pop_back();
    push_value(new_val, values, tags);
#if PYCENTAURUS
    values.front() = 0;
#endif
  }